

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O3

DataBlob __thiscall
hrgls::datablob::DataBlobSource::GetNextBlob(DataBlobSource *this,timeval timeout)

{
  long *plVar1;
  long lVar2;
  hrgls_Status hVar3;
  mapped_type mVar4;
  DataBlob_private *pDVar5;
  pthread_t pVar6;
  mapped_type *pmVar7;
  long *plVar8;
  hrgls_DataBlob blob;
  DataBlob local_48;
  key_type local_40;
  key_type local_38;
  
  plVar8 = (long *)timeout.tv_sec;
  pDVar5 = (DataBlob_private *)operator_new(0x10);
  pDVar5->blob = (hrgls_DataBlob)0x0;
  pDVar5->status = 0;
  local_48.m_private = pDVar5;
  hVar3 = hrgls_DataBlobCreate(pDVar5);
  pDVar5->status = hVar3;
  plVar1 = (long *)*plVar8;
  if (plVar1 != (long *)0x0) {
    if (*plVar1 != 0) {
      local_40._M_thread = 0;
      mVar4 = hrgls_DataBlobSourceGetNextBlob(*plVar1,&local_40,timeout.tv_usec);
      lVar2 = *plVar8;
      pVar6 = pthread_self();
      local_38._M_thread = pVar6;
      pmVar7 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                             *)(lVar2 + 8),&local_38);
      *pmVar7 = mVar4;
      local_38._M_thread = pVar6;
      pmVar7 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                             *)(*plVar8 + 8),&local_38);
      if (*pmVar7 == 1) {
        hrgls_DataBlobDestroy(local_40._M_thread);
        DataBlob::DataBlob((DataBlob *)this,&local_48);
      }
      else {
        DataBlob::DataBlob((DataBlob *)this,(hrgls_DataBlob)local_40._M_thread);
        hrgls_DataBlobDestroy(local_40._M_thread);
      }
      goto LAB_00105063;
    }
    local_40._M_thread = pthread_self();
    pmVar7 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                           *)(plVar1 + 1),&local_40);
    *pmVar7 = 0x3ee;
  }
  DataBlob::DataBlob((DataBlob *)this,&local_48);
LAB_00105063:
  DataBlob::~DataBlob(&local_48);
  return (DataBlob)(DataBlob_private *)this;
}

Assistant:

DataBlob DataBlobSource::GetNextBlob(struct timeval timeout)
    {
      DataBlob emptyRet;
      if (!m_private) {
        return emptyRet;
      }
      if (!m_private->m_stream) {
        m_private->m_status[std::this_thread::get_id()] = hrgls_STATUS_NULL_OBJECT_POINTER;
        return emptyRet;
      }
      hrgls_DataBlob blob = nullptr;
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceGetNextBlob(m_private->m_stream, &blob, timeout);
      if (m_private->m_status[std::this_thread::get_id()] == hrgls_STATUS_TIMEOUT) {
        hrgls_DataBlobDestroy(blob);
        return emptyRet;
      }
      DataBlob ret(blob);
      hrgls_DataBlobDestroy(blob);
      return ret;
    }